

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

void Abc_TtCountOnesInCofs(word *pTruth,int nVars,int *pStore)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  word *pwVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  uVar1 = (ulong)(uint)nVars;
  if (nVars < 7) {
    if (0 < nVars) {
      uVar2 = *pTruth;
      lVar5 = 0;
      do {
        uVar6 = *(ulong *)((long)s_Truths6Neg + lVar5) & uVar2;
        uVar6 = uVar6 - (uVar6 >> 1 & 0x5555555555555555);
        uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
        uVar6 = (uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f;
        uVar6 = (uVar6 >> 8) + uVar6;
        lVar7 = (uVar6 >> 0x10) + uVar6;
        *pStore = (int)((ulong)lVar7 >> 0x20) + (int)lVar7 & 0xff;
        pStore = (int *)((uint *)pStore + 1);
        lVar5 = lVar5 + 8;
      } while (uVar1 << 3 != lVar5);
    }
  }
  else {
    memset(pStore,0,uVar1 * 4);
    if (nVars + -6 != 0x1f) {
      lVar5 = 0;
      do {
        uVar2 = pTruth[lVar5];
        uVar6 = pTruth[lVar5 + 1];
        pwVar4 = s_Truths6Neg;
        lVar7 = 0;
        do {
          uVar8 = (uVar6 & *pwVar4) << ((byte)(1 << ((byte)lVar7 & 0x1f)) & 0x3f) | *pwVar4 & uVar2;
          if (uVar8 != 0) {
            uVar8 = uVar8 - (uVar8 >> 1 & 0x5555555555555555);
            uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
            uVar8 = (uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f;
            uVar8 = (uVar8 >> 8) + uVar8;
            lVar3 = (uVar8 >> 0x10) + uVar8;
            pStore[lVar7] = pStore[lVar7] + ((int)((ulong)lVar3 >> 0x20) + (int)lVar3 & 0xffU);
          }
          lVar7 = lVar7 + 1;
          pwVar4 = pwVar4 + 1;
        } while (lVar7 != 6);
        uVar2 = pTruth[lVar5];
        if (uVar2 != 0) {
          uVar2 = uVar2 - (uVar2 >> 1 & 0x5555555555555555);
          uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
          uVar2 = (uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f;
          uVar2 = (uVar2 >> 8) + uVar2;
          lVar7 = (uVar2 >> 0x10) + uVar2;
          lVar3 = 0;
          do {
            if (((uint)lVar5 >> ((uint)lVar3 & 0x1f) & 1) == 0) {
              pStore[lVar3 + 6] =
                   pStore[lVar3 + 6] + ((int)((ulong)lVar7 >> 0x20) + (int)lVar7 & 0xffU);
            }
            lVar3 = lVar3 + 1;
          } while (uVar1 - 6 != lVar3);
        }
        uVar2 = pTruth[lVar5 + 1];
        if (uVar2 != 0) {
          uVar2 = uVar2 - (uVar2 >> 1 & 0x5555555555555555);
          uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
          uVar2 = (uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f;
          uVar2 = (uVar2 >> 8) + uVar2;
          lVar7 = (uVar2 >> 0x10) + uVar2;
          lVar3 = 0;
          do {
            if ((((uint)lVar5 | 1) >> ((uint)lVar3 & 0x1f) & 1) == 0) {
              pStore[lVar3 + 6] =
                   pStore[lVar3 + 6] + ((int)((ulong)lVar7 >> 0x20) + (int)lVar7 & 0xffU);
            }
            lVar3 = lVar3 + 1;
          } while (uVar1 - 6 != lVar3);
        }
        lVar5 = lVar5 + 2;
      } while (lVar5 < 1 << ((byte)(nVars + -6) & 0x1f));
    }
  }
  return;
}

Assistant:

static inline void Abc_TtCountOnesInCofs( word * pTruth, int nVars, int * pStore )
{
    word Temp;
    int i, k, Counter, nWords;
    if ( nVars <= 6 )
    {
        for ( i = 0; i < nVars; i++ )
            pStore[i] = Abc_TtCountOnes( pTruth[0] & s_Truths6Neg[i] );
        return;
    }
    assert( nVars > 6 );
    nWords = Abc_TtWordNum( nVars );
    memset( pStore, 0, sizeof(int) * nVars );
    for ( k = 0; k < nWords; k++ )
    {
        // count 1's for the first six variables
        for ( i = 0; i < 6; i++ )
            if ( (Temp = (pTruth[k] & s_Truths6Neg[i]) | ((pTruth[k+1] & s_Truths6Neg[i]) << (1 << i))) )
                pStore[i] += Abc_TtCountOnes( Temp );
        // count 1's for all other variables
        if ( pTruth[k] )
        {
            Counter = Abc_TtCountOnes( pTruth[k] );
            for ( i = 6; i < nVars; i++ )
                if ( (k & (1 << (i-6))) == 0 )
                    pStore[i] += Counter;
        }
        k++;
        // count 1's for all other variables
        if ( pTruth[k] )
        {
            Counter = Abc_TtCountOnes( pTruth[k] );
            for ( i = 6; i < nVars; i++ )
                if ( (k & (1 << (i-6))) == 0 )
                    pStore[i] += Counter;
        }
    } 
}